

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::QGraphicsViewPrivate(QGraphicsViewPrivate *this)

{
  undefined1 *puVar1;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  byte bVar5;
  
  bVar5 = 0;
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(&this->super_QAbstractScrollAreaPrivate);
  *(undefined ***)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate
       = &PTR__QGraphicsViewPrivate_007ee690;
  this->renderHints = (QFlagsStorageHelper<QPainter::RenderHint,_4>)0x2;
  this->dragMode = NoDrag;
  *(uint *)&this->field_0x300 = *(uint *)&this->field_0x300 & 0xffffc000 | 0x18f1;
  (this->sceneRect).xp = 0.0;
  (this->sceneRect).yp = 0.0;
  (this->updateClip).x1 = 0;
  (this->updateClip).y1 = 0;
  (this->sceneRect).w = 0.0;
  (this->sceneRect).h = 0.0;
  (this->updateClip).x2 = -1;
  (this->updateClip).y2 = -1;
  (this->mousePressItemPoint).xp = 0.0;
  (this->mousePressItemPoint).yp = 0.0;
  (this->mousePressScenePoint).xp = 0.0;
  (this->mousePressScenePoint).yp = 0.0;
  (this->mousePressViewPoint).xp = 0;
  (this->mousePressViewPoint).yp = 0;
  (this->mousePressScreenPoint).xp = 0;
  (this->mousePressScreenPoint).yp = 0;
  (this->lastMouseMoveScenePoint).xp = 0.0;
  (this->lastMouseMoveScenePoint).yp = 0.0;
  (this->lastRubberbandScenePoint).xp = 0.0;
  (this->lastRubberbandScenePoint).yp = 0.0;
  (this->lastMouseMoveScreenPoint).xp = 0;
  (this->lastMouseMoveScreenPoint).yp = 0;
  (this->dirtyScrollOffset).xp = 0;
  (this->dirtyScrollOffset).yp = 0;
  this->mousePressButton = NoButton;
  pqVar3 = (qreal *)&DAT_0067b650;
  pQVar4 = &this->matrix;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pQVar4->m_matrix[0][0] = *pqVar3;
    pqVar3 = pqVar3 + (ulong)bVar5 * -2 + 1;
    pQVar4 = (QTransform *)((long)pQVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  puVar1 = &(this->matrix).field_0x48;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
  (this->lastMouseEvent).m_engaged = false;
  (this->lastCenterPoint).xp = 0.0;
  (this->lastCenterPoint).yp = 0.0;
  this->leftIndent = 0.0;
  this->topIndent = 0.0;
  (this->lastMouseEvent).field_0.m_eventNotSet = '\0';
  this->alignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x84;
  this->transformationAnchor = AnchorViewCenter;
  this->resizeAnchor = NoAnchor;
  this->viewportUpdateMode = MinimalViewportUpdate;
  (this->optimizationFlags).super_QFlagsStorageHelper<QGraphicsView::OptimizationFlag,_4>.
  super_QFlagsStorage<QGraphicsView::OptimizationFlag>.i = 0;
  this->stereoEnabled = false;
  (this->scene).wp.d = (Data *)0x0;
  (this->scene).wp.value = (QObject *)0x0;
  (this->rubberBandRect).x1 = 0;
  (this->rubberBandRect).y1 = 0;
  (this->rubberBandRect).x2 = -1;
  (this->rubberBandRect).y2 = -1;
  this->rubberBanding = false;
  this->rubberBandSelectionMode = IntersectsItemShape;
  this->rubberBandSelectionOperation = ReplaceSelection;
  this->handScrollMotions = 0;
  this->cacheMode = (QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>)0x0;
  (this->styleOptions).d.d = (Data *)0x0;
  (this->styleOptions).d.ptr = (QStyleOptionGraphicsItem *)0x0;
  (this->styleOptions).d.size = 0;
  QBrush::QBrush(&this->backgroundBrush);
  QBrush::QBrush(&this->foregroundBrush);
  QPixmap::QPixmap(&this->backgroundPixmap);
  QRegion::QRegion(&this->backgroundPixmapExposed);
  QCursor::QCursor(&this->originalCursor);
  this->hasStoredOriginalCursor = false;
  this->lastDragDropEvent = (QGraphicsSceneDragDropEvent *)0x0;
  QRegion::QRegion(&this->dirtyRegion);
  (this->dirtyBoundingRect).x1 = 0;
  (this->dirtyBoundingRect).y1 = 0;
  (this->dirtyBoundingRect).x2 = -1;
  (this->dirtyBoundingRect).y2 = -1;
  this->updateSceneSlotReimplementedChecked = false;
  QRegion::QRegion(&this->exposedRegion);
  QList<QStyleOptionGraphicsItem>::reserve(&this->styleOptions,0x1f7);
  return;
}

Assistant:

QGraphicsViewPrivate::QGraphicsViewPrivate()
    : renderHints(QPainter::TextAntialiasing),
      dragMode(QGraphicsView::NoDrag),
      sceneInteractionAllowed(true), hasSceneRect(false),
      connectedToScene(false),
      useLastMouseEvent(false),
      identityMatrix(true),
      dirtyScroll(true),
      accelerateScrolling(true),
      keepLastCenterPoint(true),
      transforming(false),
      handScrolling(false),
      mustAllocateStyleOptions(false),
      mustResizeBackgroundPixmap(true),
      fullUpdatePending(true),
      hasUpdateClip(false),
      mousePressButton(Qt::NoButton),
      leftIndent(0), topIndent(0),
      alignment(Qt::AlignCenter),
      transformationAnchor(QGraphicsView::AnchorViewCenter), resizeAnchor(QGraphicsView::NoAnchor),
      viewportUpdateMode(QGraphicsView::MinimalViewportUpdate),
      scene(nullptr),
#if QT_CONFIG(rubberband)
      rubberBanding(false),
      rubberBandSelectionMode(Qt::IntersectsItemShape),
      rubberBandSelectionOperation(Qt::ReplaceSelection),
#endif
      handScrollMotions(0),
#ifndef QT_NO_CURSOR
      hasStoredOriginalCursor(false),
#endif
      lastDragDropEvent(nullptr),
      updateSceneSlotReimplementedChecked(false)
{
    styleOptions.reserve(QGRAPHICSVIEW_PREALLOC_STYLE_OPTIONS);
}